

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void print_help(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"tmux-mem-cpu-load v");
  poVar1 = std::operator<<(poVar1,"3.4.0");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Usage: tmux-mem-cpu-load [OPTIONS]\n\n");
  poVar1 = std::operator<<(poVar1,"Available options:\n");
  poVar1 = std::operator<<(poVar1,"-h, --help\n");
  poVar1 = std::operator<<(poVar1,"\t Prints this help message\n");
  poVar1 = std::operator<<(poVar1,"-c, --colors\n");
  poVar1 = std::operator<<(poVar1,"\tUse tmux colors in output\n");
  poVar1 = std::operator<<(poVar1,"-p, --powerline-left\n");
  poVar1 = std::operator<<(poVar1,
                           "\tUse powerline left symbols throughout the output, enables --colors\n")
  ;
  poVar1 = std::operator<<(poVar1,"-q, --powerline-right\n");
  poVar1 = std::operator<<(poVar1,
                           "\tUse powerline right symbols throughout the output, enables --colors\n"
                          );
  poVar1 = std::operator<<(poVar1,"-i <value>, --interval <value>\n");
  poVar1 = std::operator<<(poVar1,
                           "\tSet tmux status refresh interval in seconds. Default: 1 second\n");
  poVar1 = std::operator<<(poVar1,"-g <value>, --graph-lines <value>\n");
  poVar1 = std::operator<<(poVar1,"\tSet how many lines should be drawn in a graph. Default: 10\n");
  poVar1 = std::operator<<(poVar1,"-m <value>, --mem-mode <value>\n");
  poVar1 = std::operator<<(poVar1,
                           "\tSet memory display mode. 0: Default, 1: Free memory, 2: Usage percent.\n"
                          );
  poVar1 = std::operator<<(poVar1,"-t <value>, --cpu-mode <value>\n");
  poVar1 = std::operator<<(poVar1,
                           "\tSet cpu % display mode. 0: Default max 100%, 1: Max 100% * number of threads. \n"
                          );
  poVar1 = std::operator<<(poVar1,"-a <value>, --averages-count <value>\n");
  poVar1 = std::operator<<(poVar1,"\tSet how many load-averages should be drawn. Default: 3\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_help()
{
  using std::cout;
  using std::endl;

  cout << "tmux-mem-cpu-load v" << tmux_mem_cpu_load_VERSION << endl
    << "Usage: tmux-mem-cpu-load [OPTIONS]\n\n"
    << "Available options:\n"
    << "-h, --help\n"
    << "\t Prints this help message\n"
    << "-c, --colors\n"
    << "\tUse tmux colors in output\n"
    << "-p, --powerline-left\n"
    << "\tUse powerline left symbols throughout the output, enables --colors\n"
    << "-q, --powerline-right\n"
    << "\tUse powerline right symbols throughout the output, enables --colors\n"
    << "-i <value>, --interval <value>\n"
    << "\tSet tmux status refresh interval in seconds. Default: 1 second\n"
    << "-g <value>, --graph-lines <value>\n"
    << "\tSet how many lines should be drawn in a graph. Default: 10\n"
    << "-m <value>, --mem-mode <value>\n"
    << "\tSet memory display mode. 0: Default, 1: Free memory, 2: Usage percent.\n"
    << "-t <value>, --cpu-mode <value>\n"
    << "\tSet cpu % display mode. 0: Default max 100%, 1: Max 100% * number of threads. \n"
    << "-a <value>, --averages-count <value>\n"
    << "\tSet how many load-averages should be drawn. Default: 3\n"
    << endl;
}